

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstanceSymbols.cpp
# Opt level: O0

void slang::ast::UnknownModuleSymbol::fromSyntax
               (Compilation *compilation,HierarchyInstantiationSyntax *syntax,
               ASTContext *parentContext,SmallVectorBase<const_slang::ast::Symbol_*> *results,
               SmallVectorBase<const_slang::ast::Symbol_*> *implicitNets)

{
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> params_00;
  bool bVar1;
  int iVar2;
  SeparatedSyntaxList<slang::syntax::ParamAssignmentSyntax> *this;
  OrderedParamAssignmentSyntax *pOVar3;
  ExpressionSyntax *pEVar4;
  undefined4 extraout_var;
  NamedParamAssignmentSyntax *pNVar5;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  EVP_PKEY_CTX *extraout_RDX;
  EVP_PKEY_CTX *extraout_RDX_00;
  EVP_PKEY_CTX *src;
  iterator iVar6;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> local_148;
  string_view local_138;
  undefined1 local_128 [8];
  span<const_slang::ast::Expression_*,_18446744073709551615UL> paramSpan;
  Expression *local_110;
  ExpressionSyntax *local_108;
  ExpressionSyntax *ex;
  Expression *local_f8;
  SyntaxNode *local_f0;
  ParamAssignmentSyntax *expr;
  iterator __end3;
  iterator __begin3;
  SeparatedSyntaxList<slang::syntax::ParamAssignmentSyntax> *__range3;
  bitmask<slang::ast::ASTFlags> local_b0;
  undefined1 local_a8 [8];
  ASTContext context;
  SmallVector<const_slang::ast::Expression_*,_5UL> params;
  SmallVectorBase<const_slang::ast::Symbol_*> *implicitNets_local;
  SmallVectorBase<const_slang::ast::Symbol_*> *results_local;
  ASTContext *parentContext_local;
  HierarchyInstantiationSyntax *syntax_local;
  Compilation *compilation_local;
  
  SmallVector<const_slang::ast::Expression_*,_5UL>::SmallVector
            ((SmallVector<const_slang::ast::Expression_*,_5UL> *)&context.assertionInstance);
  bitmask<slang::ast::ASTFlags>::bitmask(&local_b0,NonProcedural);
  ASTContext::resetFlags((ASTContext *)local_a8,parentContext,local_b0);
  src = extraout_RDX;
  if (syntax->parameters != (ParameterValueAssignmentSyntax *)0x0) {
    this = &syntax->parameters->parameters;
    iVar6 = slang::syntax::SeparatedSyntaxList<slang::syntax::ParamAssignmentSyntax>::begin(this);
    __end3.index = (size_t)iVar6.list;
    iVar6 = slang::syntax::SeparatedSyntaxList<slang::syntax::ParamAssignmentSyntax>::end(this);
    while( true ) {
      __end3.list = (ParentList *)iVar6.index;
      expr = (ParamAssignmentSyntax *)iVar6.list;
      bVar1 = iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ParamAssignmentSyntax>::iterator_base<slang::syntax::ParamAssignmentSyntax_*>,_std::random_access_iterator_tag,_slang::syntax::ParamAssignmentSyntax_*,_unsigned_long,_slang::syntax::ParamAssignmentSyntax_**,_slang::syntax::ParamAssignmentSyntax_*&>
              ::operator!=((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ParamAssignmentSyntax>::iterator_base<slang::syntax::ParamAssignmentSyntax_*>,_std::random_access_iterator_tag,_slang::syntax::ParamAssignmentSyntax_*,_unsigned_long,_slang::syntax::ParamAssignmentSyntax_**,_slang::syntax::ParamAssignmentSyntax_*&>
                            *)&__end3.index,
                           (iterator_base<slang::syntax::ParamAssignmentSyntax_*> *)&expr);
      src = extraout_RDX_00;
      if (!bVar1) break;
      local_f0 = &slang::syntax::SeparatedSyntaxList<slang::syntax::ParamAssignmentSyntax>::
                  iterator_base<slang::syntax::ParamAssignmentSyntax_*>::operator*
                            ((iterator_base<slang::syntax::ParamAssignmentSyntax_*> *)&__end3.index)
                  ->super_SyntaxNode;
      if (local_f0->kind == OrderedParamAssignment) {
        pOVar3 = slang::syntax::SyntaxNode::as<slang::syntax::OrderedParamAssignmentSyntax>
                           (local_f0);
        pEVar4 = not_null<slang::syntax::ExpressionSyntax_*>::operator*(&pOVar3->expr);
        bitmask<slang::ast::ASTFlags>::bitmask((bitmask<slang::ast::ASTFlags> *)&ex,None);
        iVar2 = Expression::bind((int)pEVar4,(sockaddr *)local_a8,(socklen_t)ex);
        local_f8 = (Expression *)CONCAT44(extraout_var,iVar2);
        SmallVectorBase<const_slang::ast::Expression_*>::push_back
                  ((SmallVectorBase<const_slang::ast::Expression_*> *)&context.assertionInstance,
                   &local_f8);
      }
      else if (local_f0->kind == NamedParamAssignment) {
        pNVar5 = slang::syntax::SyntaxNode::as<slang::syntax::NamedParamAssignmentSyntax>(local_f0);
        pEVar4 = pNVar5->expr;
        local_108 = pEVar4;
        if (pEVar4 != (ExpressionSyntax *)0x0) {
          bitmask<slang::ast::ASTFlags>::bitmask
                    ((bitmask<slang::ast::ASTFlags> *)&paramSpan.size_,AllowDataType);
          iVar2 = Expression::bind((int)pEVar4,(sockaddr *)local_a8,(socklen_t)paramSpan.size_);
          local_110 = (Expression *)CONCAT44(extraout_var_00,iVar2);
          SmallVectorBase<const_slang::ast::Expression_*>::push_back
                    ((SmallVectorBase<const_slang::ast::Expression_*> *)&context.assertionInstance,
                     &local_110);
        }
      }
      iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ParamAssignmentSyntax>::iterator_base<slang::syntax::ParamAssignmentSyntax_*>,_std::random_access_iterator_tag,_slang::syntax::ParamAssignmentSyntax_*,_unsigned_long,_slang::syntax::ParamAssignmentSyntax_**,_slang::syntax::ParamAssignmentSyntax_*&>
      ::operator++((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ParamAssignmentSyntax>::iterator_base<slang::syntax::ParamAssignmentSyntax_*>,_std::random_access_iterator_tag,_slang::syntax::ParamAssignmentSyntax_*,_unsigned_long,_slang::syntax::ParamAssignmentSyntax_**,_slang::syntax::ParamAssignmentSyntax_*&>
                    *)&__end3.index);
      iVar6.index = (size_t)__end3.list;
      iVar6.list = (ParentList *)expr;
    }
  }
  iVar2 = SmallVectorBase<const_slang::ast::Expression_*>::copy
                    ((SmallVectorBase<const_slang::ast::Expression_*> *)&context.assertionInstance,
                     (EVP_PKEY_CTX *)compilation,src);
  local_128 = (undefined1  [8])CONCAT44(extraout_var_01,iVar2);
  local_138 = parsing::Token::valueText(&syntax->type);
  nonstd::span_lite::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::
  span<const_slang::ast::Expression_*,_18446744073709551615UL,_0>
            (&local_148,(span<const_slang::ast::Expression_*,_18446744073709551615UL> *)local_128);
  params_00.size_ = local_148.size_;
  params_00.data_ = local_148.data_;
  createUnknownModules<slang::syntax::HierarchyInstantiationSyntax>
            (compilation,syntax,local_138,(ASTContext *)local_a8,params_00,results,implicitNets);
  SmallVector<const_slang::ast::Expression_*,_5UL>::~SmallVector
            ((SmallVector<const_slang::ast::Expression_*,_5UL> *)&context.assertionInstance);
  return;
}

Assistant:

void UnknownModuleSymbol::fromSyntax(Compilation& compilation,
                                     const HierarchyInstantiationSyntax& syntax,
                                     const ASTContext& parentContext,
                                     SmallVectorBase<const Symbol*>& results,
                                     SmallVectorBase<const Symbol*>& implicitNets) {
    SmallVector<const Expression*> params;
    ASTContext context = parentContext.resetFlags(ASTFlags::NonProcedural);

    if (syntax.parameters) {
        for (auto expr : syntax.parameters->parameters) {
            // Empty expressions are just ignored here.
            if (expr->kind == SyntaxKind::OrderedParamAssignment)
                params.push_back(
                    &Expression::bind(*expr->as<OrderedParamAssignmentSyntax>().expr, context));
            else if (expr->kind == SyntaxKind::NamedParamAssignment) {
                if (auto ex = expr->as<NamedParamAssignmentSyntax>().expr)
                    params.push_back(&Expression::bind(*ex, context, ASTFlags::AllowDataType));
            }
        }
    }

    auto paramSpan = params.copy(compilation);
    createUnknownModules(compilation, syntax, syntax.type.valueText(), context, paramSpan, results,
                         implicitNets);
}